

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
LinkLanguageNode::Evaluate
          (string *__return_storage_ptr__,LinkLanguageNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  long lVar4;
  const_iterator __begin1;
  pointer __rhs;
  string genName;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  
  if (((dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) ||
      (context->HeadTarget == (cmGeneratorTarget *)0x0)) ||
     ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression(dagChecker), !bVar2 &&
      (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                         (dagChecker,(cmGeneratorTarget *)0x0,ANY), !bVar2)))) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_90,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "$<LINK_LANGUAGE:...> may only be used with binary targets to specify link libraries, link directories, link options and link depends."
               ,(allocator<char> *)&local_50);
    reportError(context,&local_90,&local_70);
  }
  else {
    bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                      (dagChecker,(cmGeneratorTarget *)0x0,ANY);
    if ((!bVar2) ||
       ((parameters->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (parameters->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish)) {
      (*context->LG->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_90);
      lVar4 = std::__cxx11::string::find((char *)&local_90,0x64917e);
      if (((lVar4 == -1) &&
          (((lVar4 = std::__cxx11::string::find((char *)&local_90,0x5fef58), lVar4 == -1 &&
            (lVar4 = std::__cxx11::string::find((char *)&local_90,0x61e151), lVar4 == -1)) &&
           (lVar4 = std::__cxx11::string::find((char *)&local_90,0x644817), lVar4 == -1)))) &&
         (lVar4 = std::__cxx11::string::find((char *)&local_90,0x627b1f), lVar4 == -1)) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_70,content);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"$<LINK_LANGUAGE:...> not supported for this generator.",
                   &local_91);
        reportError(context,&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                          (dagChecker,(cmGeneratorTarget *)0x0,ANY);
        if (bVar2) {
          context->HadHeadSensitiveCondition = true;
          context->HadLinkLanguageSensitiveCondition = true;
        }
        __rhs = (parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (__rhs == pbVar1) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,(string *)&context->Language);
        }
        else {
          do {
            if (__rhs == pbVar1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"0",(allocator<char> *)&local_70);
              goto LAB_00470fb7;
            }
            _Var3 = std::operator==(&context->Language,__rhs);
            __rhs = __rhs + 1;
          } while (!_Var3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"1",(allocator<char> *)&local_70);
        }
      }
LAB_00470fb7:
      std::__cxx11::string::~string((string *)&local_90);
      return __return_storage_ptr__;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_90,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"$<LINK_LANGUAGE> is not supported in link libraries expression."
               ,(allocator<char> *)&local_50);
    reportError(context,&local_90,&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    if (!context->HeadTarget || !dagChecker ||
        !(dagChecker->EvaluatingLinkExpression() ||
          dagChecker->EvaluatingLinkLibraries())) {
      reportError(context, content->GetOriginalExpression(),
                  "$<LINK_LANGUAGE:...> may only be used with binary targets "
                  "to specify link libraries, link directories, link options "
                  "and link depends.");
      return std::string();
    }
    if (dagChecker->EvaluatingLinkLibraries() && parameters.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<LINK_LANGUAGE> is not supported in link libraries expression.");
      return std::string();
    }

    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    std::string genName = gg->GetName();
    if (genName.find("Makefiles") == std::string::npos &&
        genName.find("Ninja") == std::string::npos &&
        genName.find("Visual Studio") == std::string::npos &&
        genName.find("Xcode") == std::string::npos &&
        genName.find("Watcom WMake") == std::string::npos) {
      reportError(context, content->GetOriginalExpression(),
                  "$<LINK_LANGUAGE:...> not supported for this generator.");
      return std::string();
    }

    if (dagChecker->EvaluatingLinkLibraries()) {
      context->HadHeadSensitiveCondition = true;
      context->HadLinkLanguageSensitiveCondition = true;
    }

    if (parameters.empty()) {
      return context->Language;
    }

    for (auto const& param : parameters) {
      if (context->Language == param) {
        return "1";
      }
    }
    return "0";
  }